

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lockstep_scheduler_test.cpp
# Opt level: O2

int main(int param_1,char **param_2)

{
  ostream *poVar1;
  uint iteration;
  long lVar2;
  
  for (lVar2 = 1; lVar2 != 0x2711; lVar2 = lVar2 + 1) {
    poVar1 = std::operator<<((ostream *)&std::cout,"Test iteration: ");
    poVar1 = std::ostream::_M_insert<unsigned_long>((ulong)poVar1);
    std::operator<<(poVar1,"\n");
    test_absolute_time();
    test_condition_timing_out();
    test_locked_semaphore_getting_unlocked();
    test_usleep();
    test_multiple_semaphores_waiting();
  }
  return 0;
}

Assistant:

int main(int /*argc*/, char** /*argv*/)
{
    for (unsigned iteration = 1; iteration <= 10000; ++iteration) {
        std::cout << "Test iteration: " << iteration << "\n";
        test_absolute_time();
        test_condition_timing_out();
        test_locked_semaphore_getting_unlocked();
        test_usleep();
        test_multiple_semaphores_waiting();
    }

    return 0;
}